

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Action __thiscall
psy::C::TypeChecker::visitAssignmentExpression(TypeChecker *this,AssignmentExpressionSyntax *node)

{
  Action AVar1;
  bool bVar2;
  SyntaxKind SVar3;
  ExpressionSyntax *pEVar4;
  ostream *poVar5;
  SyntaxToken local_68;
  Type *local_30;
  Type *rightTy;
  Type *leftTy;
  AssignmentExpressionSyntax *node_local;
  TypeChecker *this_local;
  
  leftTy = (Type *)node;
  node_local = (AssignmentExpressionSyntax *)this;
  pEVar4 = AssignmentExpressionSyntax::left(node);
  AVar1 = visitExpression(this,&pEVar4->super_SyntaxNode);
  if (AVar1 == Quit) {
    this_local._7_1_ = Quit;
  }
  else {
    pEVar4 = AssignmentExpressionSyntax::left((AssignmentExpressionSyntax *)leftTy);
    bVar2 = isAssignable(this,&pEVar4->super_SyntaxNode,this->ty_);
    if (bVar2) {
      rightTy = unqualifiedAndResolved(this->ty_);
      pEVar4 = AssignmentExpressionSyntax::right((AssignmentExpressionSyntax *)leftTy);
      AVar1 = visitExpression(this,&pEVar4->super_SyntaxNode);
      if (AVar1 == Quit) {
        this_local._7_1_ = Quit;
      }
      else {
        local_30 = unqualifiedAndResolved(this->ty_);
        AssignmentExpressionSyntax::operatorToken(&local_68,(AssignmentExpressionSyntax *)leftTy);
        SVar3 = SyntaxToken::kind(&local_68);
        SyntaxToken::~SyntaxToken(&local_68);
        switch(SVar3) {
        case LessThanEqualsToken:
        case GreaterThanEqualsToken:
          this_local._7_1_ =
               visitBinaryExpression_BitwiseShift<psy::C::AssignmentExpressionSyntax>
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
          break;
        default:
          poVar5 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
          poVar5 = std::operator<<(poVar5,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                                  );
          poVar5 = std::operator<<(poVar5,":");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x56c);
          poVar5 = std::operator<<(poVar5," ");
          poVar5 = std::operator<<(poVar5,"<empty message>");
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          this_local._7_1_ = Quit;
          break;
        case ExclamationEqualsToken:
        case AmpersandEqualsToken:
        case CaretEqualsToken:
          this_local._7_1_ =
               visitBinaryExpression_Bitwise<psy::C::AssignmentExpressionSyntax>
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
          break;
        case EqualsToken:
          this_local._7_1_ =
               visitAssignmentExpression_Simple
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
          break;
        case AsteriskEqualsToken:
        case SlashEqualsToken:
          this_local._7_1_ =
               visitBinaryExpression_MultiplicationOrDivision<psy::C::AssignmentExpressionSyntax>
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
          break;
        case PercentEqualsToken:
          this_local._7_1_ =
               visitBinaryExpression_Remainder<psy::C::AssignmentExpressionSyntax>
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
          break;
        case PlusEqualsToken:
          this_local._7_1_ =
               visitBinaryExpression_Addition<psy::C::AssignmentExpressionSyntax>
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
          break;
        case MinusEqualsToken:
          this_local._7_1_ =
               visitBinaryExpression_Subtraction<psy::C::AssignmentExpressionSyntax>
                         (this,(AssignmentExpressionSyntax *)leftTy,rightTy,local_30);
        }
      }
    }
    else {
      this_local._7_1_ = Quit;
    }
  }
  return this_local._7_1_;
}

Assistant:

SyntaxVisitor::Action TypeChecker::visitAssignmentExpression(
        const AssignmentExpressionSyntax* node)
{
    VISIT_EXPR(node->left());
    if (!isAssignable(node->left(), ty_))
        return Action::Quit;
    auto leftTy = unqualifiedAndResolved(ty_);
    VISIT_EXPR(node->right());
    auto rightTy = unqualifiedAndResolved(ty_);

    switch (node->operatorToken().kind()) {
        case SyntaxKind::EqualsToken:
            return visitAssignmentExpression_Simple(node, leftTy, rightTy);
        case SyntaxKind::AsteriskEqualsToken:
        case SyntaxKind::SlashEqualsToken:
            return visitBinaryExpression_MultiplicationOrDivision(node, leftTy, rightTy);
        case SyntaxKind::PercentEqualsToken:
            return visitBinaryExpression_Remainder(node, leftTy, rightTy);
        case SyntaxKind::PlusEqualsToken:
            return visitBinaryExpression_Addition(node, leftTy, rightTy);
        case SyntaxKind::MinusEqualsToken:
            return visitBinaryExpression_Subtraction(node, leftTy, rightTy);
        case SyntaxKind::LessThanEqualsToken:
        case SyntaxKind::GreaterThanEqualsToken:
            return visitBinaryExpression_BitwiseShift(node, leftTy, rightTy);
        case SyntaxKind::AmpersandEqualsToken:
        case SyntaxKind::ExclamationEqualsToken:
        case SyntaxKind::CaretEqualsToken:
            return visitBinaryExpression_Bitwise(node, leftTy, rightTy);
        default:
            PSY_ASSERT_1(false);
            return Action::Quit;
    }

    return Action::Skip;
}